

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadMatrixVecs(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  SPxOut *pSVar1;
  char cVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  long lVar4;
  ulong uVar5;
  Verbosity old_verbosity;
  Verbosity local_1c;
  
  pSVar1 = this->spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
    local_1c = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],
               "IBASIS01 loadMatrixVecs() invalidates factorization",0x33);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_1c);
  }
  this->nzCount = 0;
  lVar4 = (long)(this->theLP->thecovectors->set).thenum;
  if (0 < lVar4) {
    uVar5 = lVar4 + 1;
    lVar4 = lVar4 * 8;
    do {
      pSVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::vector(this->theLP,
                        (SPxId *)((long)&(this->theBaseId).data[-1].super_DataKey.info + lVar4));
      (this->matrix).data[uVar5 - 2] = pSVar3;
      this->nzCount = this->nzCount + (this->matrix).data[uVar5 - 2]->memused;
      uVar5 = uVar5 - 1;
      lVar4 = lVar4 + -8;
    } while (1 < uVar5);
  }
  this->matrixIsSetup = true;
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadMatrixVecs()
{
   assert(theLP != nullptr);
   assert(theLP->dim() == matrix.size());

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS01 loadMatrixVecs() invalidates factorization"
                 << std::endl;)

   int i;
   nzCount = 0;

   for(i = theLP->dim() - 1; i >= 0; --i)
   {
      matrix[i] = &theLP->vector(baseId(i));
      nzCount += matrix[i]->size();
   }

   matrixIsSetup = true;
   factorized = false;

   if(factor != nullptr)
      factor->clear();
}